

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O3

bool __thiscall
USBSignalFilter::SkipNoise
          (USBSignalFilter *this,AnalyzerChannelData *pNearer,AnalyzerChannelData *pFurther)

{
  char cVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((this->mSampleDur <= 20.0) && (bVar2 = false, this->mSpeed != FULL_SPEED)) {
    cVar1 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)pNearer);
    if (cVar1 == '\0') {
      bVar2 = false;
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pFurther);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool USBSignalFilter::SkipNoise( AnalyzerChannelData* pNearer, AnalyzerChannelData* pFurther )
{
    if( mSampleDur > 20 // sample rate < 50Mhz?
        || mSpeed == FULL_SPEED )
        return false;

    // up to 20ns
    const U32 IGNORE_PULSE_SAMPLES = mSampleDur == 10 ? 2 : 1;

    // skip the glitch
    if( pNearer->WouldAdvancingCauseTransition( IGNORE_PULSE_SAMPLES ) )
    {
        pNearer->AdvanceToNextEdge();
        pFurther->AdvanceToAbsPosition( pNearer->GetSampleNumber() );

        return true;
    }

    return false;
}